

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VDotProdMulti_Serial(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  int iVar1;
  long lVar2;
  long lVar3;
  realtype *in_RCX;
  undefined8 *in_RDX;
  N_Vector in_RSI;
  int in_EDI;
  realtype rVar4;
  realtype *yd;
  realtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  int local_28;
  int local_24;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    rVar4 = N_VDotProd_Serial(in_RSI,(N_Vector)*in_RDX);
    *in_RCX = rVar4;
    local_4 = 0;
  }
  else {
    iVar1 = *in_RSI->content;
    lVar2 = *(long *)((long)in_RSI->content + 8);
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      lVar3 = *(long *)(*(long *)in_RDX[local_24] + 8);
      in_RCX[local_24] = 0.0;
      for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
        in_RCX[local_24] =
             *(double *)(lVar2 + (long)local_28 * 8) * *(double *)(lVar3 + (long)local_28 * 8) +
             in_RCX[local_24];
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int N_VDotProdMulti_Serial(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VDotProd */
  if (nvec == 1) {
    dotprods[0] = N_VDotProd_Serial(x, Y[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /* compute multiple dot products */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    dotprods[i] = ZERO;
    for (j=0; j<N; j++) {
      dotprods[i] += xd[j] * yd[j];
    }
  }

  return(0);
}